

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__math
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  size_t sVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  math__AttributeData *pmVar5;
  StringHash SVar6;
  char **ppcVar7;
  long lVar8;
  undefined8 *puVar9;
  xmlChar **ppxVar10;
  StringHashPair SVar11;
  bool failed;
  ParserChar *attributeValue;
  StackMemoryManager *local_138;
  URI *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  URI *local_120;
  URI local_118;
  
  pmVar5 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::math__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar10 = attributes->attributes;
  if (ppxVar10 != (xmlChar **)0x0) {
    local_120 = &pmVar5->href;
    local_128 = &pmVar5->_class;
    local_130 = &pmVar5->altimg;
    local_138 = &(this->
                 super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                 ).super_ParserTemplateBase.mStackMemoryManager;
    for (; text = *ppxVar10, text != (ParserChar *)0x0; ppxVar10 = ppxVar10 + 2) {
      SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text);
      attributeValue = ppxVar10[1];
      if (SVar6 == 0x6f4) {
        pmVar5->id = attributeValue;
      }
      else if (SVar6 == 0x6f8b6) {
        GeneratedSaxParser::Utils::toURI(&local_118,&attributeValue,&failed);
        COLLADABU::URI::operator=(local_120,&local_118);
        COLLADABU::URI::~URI(&local_118);
        if ((failed == true) &&
           (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,0x6f8b6,attributeValue), bVar3
           )) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&pmVar5->present_attributes = (byte)pmVar5->present_attributes | 4;
        }
      }
      else if (SVar6 == 0x74835) {
        pmVar5->name = attributeValue;
      }
      else if (SVar6 == 0x7c065) {
        pmVar5->type = attributeValue;
      }
      else if (SVar6 == 0x7f8b6) {
        pmVar5->xref = attributeValue;
      }
      else if (SVar6 == 0x6a28a3) {
        bVar3 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,attributeValue,local_128);
        if (bVar3) {
          *(byte *)&pmVar5->present_attributes = (byte)pmVar5->present_attributes | 2;
        }
        else {
          SVar6 = 0x6a28a3;
LAB_0076cf8f:
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,SVar6,attributeValue);
          if (bVar3) {
            return false;
          }
        }
      }
      else if (SVar6 == 0x7ac025) {
        pmVar5->style = attributeValue;
      }
      else if (SVar6 == 0x7dfba8) {
        pmVar5->width = attributeValue;
      }
      else if (SVar6 != 0x7f4353) {
        if (SVar6 == 0x683b037) {
          GeneratedSaxParser::Utils::toURI(&local_118,&attributeValue,&failed);
          COLLADABU::URI::operator=(local_130,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((failed == true) &&
             (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,0x683b037,attributeValue),
             bVar3)) {
            return false;
          }
          if ((failed & 1U) == 0) {
            *(byte *)&pmVar5->present_attributes = (byte)pmVar5->present_attributes | 1;
          }
        }
        else if (SVar6 == 0x6ebfdf4) {
          pmVar5->height = attributeValue;
        }
        else if (SVar6 == 0x737a963) {
          pmVar5->macros = attributeValue;
        }
        else if (SVar6 == 0x83bac94) {
          pmVar5->alttext = attributeValue;
        }
        else if (SVar6 == 0xcc8d607) {
          SVar6 = GeneratedSaxParser::Utils::calculateStringHash(attributeValue,(bool *)&local_118);
          lVar2 = 0;
          do {
            lVar8 = lVar2;
            if (lVar8 + 0x10 == 0x50) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = 1;
              pmVar5->overflow = ENUM__mathml__overflow__COUNT;
              SVar6 = 0xcc8d607;
              goto LAB_0076cf8f;
            }
            lVar2 = lVar8 + 0x10;
          } while (*(StringHash *)((long)&ENUM__mathml__overflowMap + lVar8) != SVar6);
          pmVar5->overflow = *(ENUM__mathml__overflow *)((long)&DAT_008693e8 + lVar8);
        }
        else if (SVar6 == 0xb0a72e9) {
          SVar6 = GeneratedSaxParser::Utils::calculateStringHash(attributeValue,(bool *)&local_118);
          puVar9 = &ENUM__mathml__displayMap;
          if (SVar6 != 0x69359b) {
            if (SVar6 != 0x7053045) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = 1;
              pmVar5->display = ENUM__mathml__display__COUNT;
              SVar6 = 0xb0a72e9;
              goto LAB_0076cf8f;
            }
            puVar9 = &DAT_00869430;
          }
          pmVar5->display = *(ENUM__mathml__display *)(puVar9 + 1);
        }
        else if (SVar6 == 0x89c2ac5) {
          pmVar5->baseline = attributeValue;
        }
        else {
          SVar11 = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(text);
          if (SVar11.first != 0x7f4353) {
            if ((pmVar5->unknownAttributes).data == (char **)0x0) {
              ppcVar7 = (char **)GeneratedSaxParser::StackMemoryManager::newObject(local_138,0x10);
            }
            else {
              ppcVar7 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(local_138,0x10);
            }
            (pmVar5->unknownAttributes).data = ppcVar7;
            sVar1 = (pmVar5->unknownAttributes).size;
            ppcVar7[sVar1] = text;
            (pmVar5->unknownAttributes).data[sVar1 + 1] = attributeValue;
            (pmVar5->unknownAttributes).size = sVar1 + 2;
          }
        }
      }
    }
  }
  uVar4 = pmVar5->present_attributes;
  if ((uVar4 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pmVar5->altimg,&local_118);
    COLLADABU::URI::~URI(&local_118);
    uVar4 = pmVar5->present_attributes;
  }
  if ((uVar4 & 2) == 0) {
    (pmVar5->_class).data = (ParserString *)0x0;
    (pmVar5->_class).size = 0;
  }
  if ((uVar4 & 4) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pmVar5->href,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__math( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__math( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

math__AttributeData* attributeData = newData<math__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_BASELINE:
    {

attributeData->baseline = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_OVERFLOW:
    {
bool failed;
attributeData->overflow = Utils::toEnum<ENUM__mathml__overflow, StringHash, ENUM__mathml__overflow__COUNT>(attributeValue, failed, ENUM__mathml__overflowMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_OVERFLOW,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ALTIMG:
    {
bool failed;
attributeData->altimg = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_ALTIMG,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE_ALTIMG_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_ALTTEXT:
    {

attributeData->alttext = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HEIGHT:
    {

attributeData->height = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_WIDTH:
    {

attributeData->width = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_MACROS:
    {

attributeData->macros = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DISPLAY:
    {
bool failed;
attributeData->display = Utils::toEnum<ENUM__mathml__display, StringHash, ENUM__mathml__display__COUNT>(attributeValue, failed, ENUM__mathml__displayMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_DISPLAY,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_MATH, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MATH,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_XMLNS:
    {
    // ignore

    break;
    }
    default:
    {
        StringHashPair hashPair = Utils::calculateStringHashWithNamespace( attribute );
        if ( hashPair.first != HASH_ATTRIBUTE_XMLNS )
        {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;
        }
        else
        {
            // ignore
        }

    }
    }
    }
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE_ALTIMG_PRESENT) == 0)
{
    attributeData->altimg = COLLADABU::URI("");
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}